

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O1

shared_ptr<MyCompiler::AddSubOp> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::AddSubOp>(RecursiveDescentParser *this)

{
  char *pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::AddSubOp> sVar2;
  undefined1 local_19;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::AddSubOp,std::allocator<MyCompiler::AddSubOp>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,(AddSubOp **)this,
             (allocator<MyCompiler::AddSubOp> *)&local_19);
  pcVar1 = "-";
  if (in_RSI->sym == PLUS) {
    pcVar1 = "+";
  }
  std::__cxx11::string::_M_replace
            ((ulong)(this->stream + 0x28),0,*(char **)(this->stream + 0x30),(ulong)pcVar1);
  nextSym(in_RSI);
  sVar2.super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::AddSubOp>)
         sVar2.super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::AddSubOp> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<AddSubOp>();

    switch (sym)
    {
        case SymbolType::PLUS:
            pResult->value = "+";
            break;
        default: // case SymbolType::MINUS:
            pResult->value = "-";
    }
    accept(sym);

    return pResult;
}